

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_1x1_pack4.h
# Opt level: O2

void ncnn::conv1x1s1_sgemm_pack4_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float fVar5;
  undefined1 auVar6 [32];
  void *pvVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  void *pvVar27;
  void *pvVar28;
  int iVar29;
  long lVar30;
  int iVar31;
  uint uVar32;
  ulong uVar33;
  int ii;
  ulong uVar34;
  undefined1 (*pauVar35) [16];
  int _h;
  uint uVar36;
  undefined1 (*pauVar37) [32];
  undefined1 (*pauVar38) [32];
  ulong uVar39;
  uint uVar40;
  bool bVar41;
  float fVar42;
  float fVar45;
  float fVar46;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  Mat local_d0;
  float zeros [4];
  Mat tmp;
  
  uVar33 = (long)bottom_blob->h * (long)bottom_blob->w;
  _h = bottom_blob->c;
  uVar36 = top_blob->c;
  uVar32 = (uint)uVar33;
  pvVar7 = _bias->data;
  uVar39 = (ulong)(uint)((int)uVar32 >> 0x1f) << 0x20 | uVar33 & 0xffffffff;
  Mat::Mat(&tmp,4,_h,
           (int)((long)uVar39 / 4) +
           (int)((long)((ulong)(uint)((int)uVar32 >> 0x1f) << 0x20 | uVar33 & 0xffffffff) % 2) +
           (int)(char)((char)((long)uVar39 % 4) / '\x02'),bottom_blob->elemsize,
           bottom_blob->elempack,opt->workspace_allocator);
  uVar39 = 0;
  if (_h < 1) {
    _h = 0;
  }
  uVar34 = (ulong)(uint)((int)uVar32 >> 2);
  if ((int)uVar32 >> 2 < 1) {
    uVar34 = uVar39;
  }
  for (; uVar39 != uVar34; uVar39 = uVar39 + 1) {
    Mat::channel(&local_d0,bottom_blob,0);
    pvVar27 = local_d0.data;
    Mat::~Mat(&local_d0);
    Mat::channel(&local_d0,&tmp,(int)uVar39);
    pauVar38 = (undefined1 (*) [32])local_d0.data;
    pauVar37 = (undefined1 (*) [32])((long)pvVar27 + uVar39 * 2 * 0x20);
    Mat::~Mat(&local_d0);
    iVar29 = _h;
    while (bVar41 = iVar29 != 0, iVar29 = iVar29 + -1, bVar41) {
      auVar6 = pauVar37[1];
      *pauVar38 = *pauVar37;
      pauVar38[1] = auVar6;
      pauVar38 = pauVar38 + 2;
      pauVar37 = (undefined1 (*) [32])(*pauVar37 + bottom_blob->cstep * 0x10);
    }
  }
  uVar33 = uVar33 & 0xfffffffffffffffc;
  uVar40 = uVar32 >> 1 & 1;
  for (uVar39 = 0; uVar39 != uVar40; uVar39 = uVar39 + 1) {
    Mat::channel(&local_d0,bottom_blob,0);
    pvVar27 = local_d0.data;
    uVar34 = uVar33 + uVar39 * 2;
    Mat::~Mat(&local_d0);
    uVar34 = (ulong)(uint)((int)uVar34 >> 0x1f) << 0x20 | uVar34 & 0xffffffff;
    Mat::channel(&local_d0,&tmp,((int)((long)uVar34 % 4) >> 1) + (int)((long)uVar34 / 4));
    pauVar38 = (undefined1 (*) [32])local_d0.data;
    pauVar37 = (undefined1 (*) [32])
               (*(undefined1 (*) [32])((long)pvVar27 + uVar39 * 0x20) + uVar33 * 0x10);
    Mat::~Mat(&local_d0);
    iVar29 = _h;
    while (bVar41 = iVar29 != 0, iVar29 = iVar29 + -1, bVar41) {
      *pauVar38 = *pauVar37;
      pauVar38 = pauVar38 + 1;
      pauVar37 = (undefined1 (*) [32])(*pauVar37 + bottom_blob->cstep * 0x10);
    }
  }
  for (uVar33 = (ulong)(int)((int)uVar33 + uVar40 * 2); (long)uVar33 < (long)(int)uVar32;
      uVar33 = uVar33 + 1) {
    Mat::channel(&local_d0,bottom_blob,0);
    pvVar27 = local_d0.data;
    Mat::~Mat(&local_d0);
    uVar40 = (int)uVar33 >> 0x1f;
    uVar39 = (ulong)uVar40 << 0x20 | uVar33 & 0xffffffff;
    Mat::channel(&local_d0,&tmp,
                 (int)((long)((ulong)uVar40 << 0x20 | uVar33 & 0xffffffff) % 2) +
                 (int)((long)uVar39 / 4) + (int)(char)((char)((long)uVar39 % 4) / '\x02'));
    pauVar38 = (undefined1 (*) [32])local_d0.data;
    pauVar35 = (undefined1 (*) [16])((undefined1 *)pvVar27 + uVar33 * 0x10);
    Mat::~Mat(&local_d0);
    iVar29 = _h;
    while (bVar41 = iVar29 != 0, iVar29 = iVar29 + -1, bVar41) {
      *(undefined1 (*) [16])*pauVar38 = *pauVar35;
      pauVar38 = (undefined1 (*) [32])(*pauVar38 + 0x10);
      pauVar35 = pauVar35 + bottom_blob->cstep;
    }
  }
  uVar39 = 0;
  uVar33 = (ulong)uVar36;
  if ((int)uVar36 < 1) {
    uVar33 = uVar39;
  }
  for (; uVar39 != uVar33; uVar39 = uVar39 + 1) {
    iVar29 = (int)uVar39;
    Mat::channel(&local_d0,top_blob,iVar29);
    pauVar38 = (undefined1 (*) [32])local_d0.data;
    Mat::~Mat(&local_d0);
    zeros[0] = 0.0;
    zeros[1] = 0.0;
    zeros[2] = 0.0;
    zeros[3] = 0.0;
    pauVar35 = (undefined1 (*) [16])(uVar39 * 0x10 + (long)pvVar7);
    if (pvVar7 == (void *)0x0) {
      pauVar35 = (undefined1 (*) [16])zeros;
    }
    for (uVar34 = 0; (int)((uint)uVar34 | 3) < (int)uVar32; uVar34 = (ulong)((uint)uVar34 + 4)) {
      Mat::channel(&local_d0,&tmp,(int)(uVar34 >> 2));
      pvVar27 = local_d0.data;
      Mat::~Mat(&local_d0);
      Mat::channel(&local_d0,kernel,iVar29);
      pvVar28 = local_d0.data;
      Mat::~Mat(&local_d0);
      auVar43 = *pauVar35;
      lVar30 = 0;
      auVar48 = auVar43;
      auVar50 = auVar43;
      auVar51 = auVar43;
      iVar31 = _h;
      while (bVar41 = iVar31 != 0, iVar31 = iVar31 + -1, bVar41) {
        fVar42 = *(float *)((undefined1 *)pvVar27 + lVar30);
        fVar45 = *(float *)((undefined1 *)pvVar27 + lVar30 + 4);
        fVar46 = *(float *)((undefined1 *)pvVar27 + lVar30 + 8);
        fVar47 = *(float *)((undefined1 *)pvVar27 + lVar30 + 0xc);
        pfVar1 = (float *)((undefined1 *)pvVar28 + lVar30);
        fVar19 = *pfVar1;
        fVar20 = pfVar1[1];
        fVar21 = pfVar1[2];
        fVar22 = pfVar1[3];
        pfVar1 = (float *)((undefined1 *)pvVar28 + lVar30 + 0x10);
        fVar23 = *pfVar1;
        fVar24 = pfVar1[1];
        fVar25 = pfVar1[2];
        fVar26 = pfVar1[3];
        fVar8 = auVar51._4_4_;
        fVar9 = auVar51._8_4_;
        fVar10 = auVar51._12_4_;
        auVar44 = *(undefined1 (*) [16])(*(undefined1 (*) [32])((long)pvVar28 + 0x20) + lVar30);
        fVar11 = auVar44._0_4_;
        fVar13 = auVar44._4_4_;
        fVar15 = auVar44._8_4_;
        fVar17 = auVar44._12_4_;
        fVar5 = *(float *)((undefined1 *)pvVar27 + lVar30 + 0x10);
        auVar44 = *(undefined1 (*) [16])
                   (*(undefined1 (*) [32])((long)pvVar28 + 0x20) + lVar30 + 0x10);
        fVar12 = auVar44._0_4_;
        fVar14 = auVar44._4_4_;
        fVar16 = auVar44._8_4_;
        fVar18 = auVar44._12_4_;
        auVar51._0_4_ =
             fVar47 * fVar12 + fVar19 * fVar42 + auVar51._0_4_ + fVar46 * fVar11 + fVar23 * fVar45;
        auVar51._4_4_ =
             fVar47 * fVar14 + fVar20 * fVar42 + fVar8 + fVar46 * fVar13 + fVar24 * fVar45;
        auVar51._8_4_ =
             fVar47 * fVar16 + fVar21 * fVar42 + fVar9 + fVar46 * fVar15 + fVar25 * fVar45;
        auVar51._12_4_ =
             fVar47 * fVar18 + fVar22 * fVar42 + fVar10 + fVar46 * fVar17 + fVar26 * fVar45;
        fVar42 = *(float *)((undefined1 *)pvVar27 + lVar30 + 0x14);
        fVar8 = auVar50._4_4_;
        fVar9 = auVar50._8_4_;
        fVar10 = auVar50._12_4_;
        fVar45 = *(float *)((undefined1 *)pvVar27 + lVar30 + 0x18);
        fVar46 = *(float *)((undefined1 *)pvVar27 + lVar30 + 0x1c);
        fVar47 = *(float *)(*(undefined1 (*) [32])((long)pvVar27 + 0x20) + lVar30);
        auVar50._0_4_ =
             fVar46 * fVar12 + fVar42 * fVar23 + fVar45 * fVar11 + fVar5 * fVar19 + auVar50._0_4_;
        auVar50._4_4_ = fVar46 * fVar14 + fVar42 * fVar24 + fVar45 * fVar13 + fVar5 * fVar20 + fVar8
        ;
        auVar50._8_4_ = fVar46 * fVar16 + fVar42 * fVar25 + fVar45 * fVar15 + fVar5 * fVar21 + fVar9
        ;
        auVar50._12_4_ =
             fVar46 * fVar18 + fVar42 * fVar26 + fVar45 * fVar17 + fVar5 * fVar22 + fVar10;
        fVar42 = *(float *)(*(undefined1 (*) [32])((long)pvVar27 + 0x20) + lVar30 + 4);
        fVar5 = auVar48._4_4_;
        fVar8 = auVar48._8_4_;
        fVar9 = auVar48._12_4_;
        fVar45 = *(float *)(*(undefined1 (*) [32])((long)pvVar27 + 0x20) + lVar30 + 8);
        fVar46 = *(float *)(*(undefined1 (*) [32])((long)pvVar27 + 0x20) + lVar30 + 0xc);
        auVar48._0_4_ =
             fVar46 * fVar12 + fVar42 * fVar23 + fVar45 * fVar11 + fVar47 * fVar19 + auVar48._0_4_;
        auVar48._4_4_ =
             fVar46 * fVar14 + fVar42 * fVar24 + fVar45 * fVar13 + fVar47 * fVar20 + fVar5;
        auVar48._8_4_ =
             fVar46 * fVar16 + fVar42 * fVar25 + fVar45 * fVar15 + fVar47 * fVar21 + fVar8;
        auVar48._12_4_ =
             fVar46 * fVar18 + fVar42 * fVar26 + fVar45 * fVar17 + fVar47 * fVar22 + fVar9;
        fVar42 = *(float *)(*(undefined1 (*) [32])((long)pvVar27 + 0x20) + lVar30 + 0x10);
        fVar5 = auVar43._4_4_;
        fVar8 = auVar43._8_4_;
        fVar9 = auVar43._12_4_;
        fVar45 = *(float *)(*(undefined1 (*) [32])((long)pvVar27 + 0x20) + lVar30 + 0x14);
        fVar46 = *(float *)(*(undefined1 (*) [32])((long)pvVar27 + 0x20) + lVar30 + 0x18);
        fVar47 = *(float *)(*(undefined1 (*) [32])((long)pvVar27 + 0x20) + lVar30 + 0x1c);
        auVar43._0_4_ =
             fVar42 * fVar19 + auVar43._0_4_ + fVar23 * fVar45 + fVar11 * fVar46 + fVar12 * fVar47;
        auVar43._4_4_ =
             fVar42 * fVar20 + fVar5 + fVar24 * fVar45 + fVar13 * fVar46 + fVar14 * fVar47;
        auVar43._8_4_ =
             fVar42 * fVar21 + fVar8 + fVar25 * fVar45 + fVar15 * fVar46 + fVar16 * fVar47;
        auVar43._12_4_ =
             fVar42 * fVar22 + fVar9 + fVar26 * fVar45 + fVar17 * fVar46 + fVar18 * fVar47;
        lVar30 = lVar30 + 0x40;
      }
      *(undefined1 (*) [16])*pauVar38 = auVar51;
      *(undefined1 (*) [16])(*pauVar38 + 0x10) = auVar50;
      *(undefined1 (*) [16])pauVar38[1] = auVar48;
      *(undefined1 (*) [16])(pauVar38[1] + 0x10) = auVar43;
      pauVar38 = pauVar38 + 2;
    }
    while (uVar36 = (uint)uVar34, (int)(uVar36 | 1) < (int)uVar32) {
      Mat::channel(&local_d0,&tmp,(int)(uVar34 >> 2) + (uint)((uVar36 >> 1 & 1) != 0));
      pvVar27 = local_d0.data;
      Mat::~Mat(&local_d0);
      Mat::channel(&local_d0,kernel,iVar29);
      pvVar28 = local_d0.data;
      Mat::~Mat(&local_d0);
      auVar44 = *pauVar35;
      lVar30 = 0;
      iVar31 = _h;
      auVar49 = auVar44;
      while (bVar41 = iVar31 != 0, iVar31 = iVar31 + -1, bVar41) {
        fVar42 = *(float *)((undefined1 *)pvVar27 + lVar30);
        fVar45 = *(float *)((undefined1 *)pvVar27 + lVar30 + 4);
        fVar46 = *(float *)((undefined1 *)pvVar27 + lVar30 + 8);
        fVar47 = *(float *)((undefined1 *)pvVar27 + lVar30 + 0xc);
        fVar5 = *(float *)((undefined1 *)pvVar27 + lVar30 + 0x10);
        fVar8 = *(float *)((undefined1 *)pvVar27 + lVar30 + 0x14);
        fVar9 = *(float *)((undefined1 *)pvVar27 + lVar30 + 0x18);
        fVar10 = *(float *)((undefined1 *)pvVar27 + lVar30 + 0x1c);
        auVar43 = *(undefined1 (*) [16])((undefined1 *)pvVar28 + lVar30 * 2);
        auVar48 = *(undefined1 (*) [16])((undefined1 *)pvVar28 + lVar30 * 2 + 0x10);
        auVar50 = *(undefined1 (*) [16])(*(undefined1 (*) [32])((long)pvVar28 + 0x20) + lVar30 * 2);
        auVar51 = *(undefined1 (*) [16])
                   (*(undefined1 (*) [32])((long)pvVar28 + 0x20) + lVar30 * 2 + 0x10);
        fVar11 = auVar44._4_4_;
        fVar12 = auVar44._8_4_;
        fVar13 = auVar44._12_4_;
        auVar44._0_4_ =
             auVar43._0_4_ * fVar42 + auVar44._0_4_ +
             auVar48._0_4_ * fVar45 + auVar50._0_4_ * fVar46 + auVar51._0_4_ * fVar47;
        auVar44._4_4_ =
             auVar43._4_4_ * fVar42 + fVar11 + auVar48._4_4_ * fVar45 + auVar50._4_4_ * fVar46 +
             auVar51._4_4_ * fVar47;
        auVar44._8_4_ =
             auVar43._8_4_ * fVar42 + fVar12 + auVar48._8_4_ * fVar45 + auVar50._8_4_ * fVar46 +
             auVar51._8_4_ * fVar47;
        auVar44._12_4_ =
             auVar43._12_4_ * fVar42 + fVar13 + auVar48._12_4_ * fVar45 + auVar50._12_4_ * fVar46 +
             auVar51._12_4_ * fVar47;
        fVar42 = auVar49._4_4_;
        fVar45 = auVar49._8_4_;
        fVar46 = auVar49._12_4_;
        auVar49._0_4_ =
             auVar43._0_4_ * fVar5 + auVar49._0_4_ + auVar48._0_4_ * fVar8 + auVar50._0_4_ * fVar9 +
             auVar51._0_4_ * fVar10;
        auVar49._4_4_ =
             auVar43._4_4_ * fVar5 + fVar42 + auVar48._4_4_ * fVar8 + auVar50._4_4_ * fVar9 +
             auVar51._4_4_ * fVar10;
        auVar49._8_4_ =
             auVar43._8_4_ * fVar5 + fVar45 + auVar48._8_4_ * fVar8 + auVar50._8_4_ * fVar9 +
             auVar51._8_4_ * fVar10;
        auVar49._12_4_ =
             auVar43._12_4_ * fVar5 + fVar46 + auVar48._12_4_ * fVar8 + auVar50._12_4_ * fVar9 +
             auVar51._12_4_ * fVar10;
        lVar30 = lVar30 + 0x20;
      }
      *(undefined1 (*) [16])*pauVar38 = auVar44;
      *(undefined1 (*) [16])(*pauVar38 + 0x10) = auVar49;
      pauVar38 = pauVar38 + 1;
      uVar34 = (ulong)(uVar36 + 2);
    }
    while (uVar36 = (uint)uVar34, (int)uVar36 < (int)uVar32) {
      Mat::channel(&local_d0,&tmp,(uVar36 & 1) + (int)(uVar34 >> 2) + (uint)((uVar36 >> 1 & 1) != 0)
                  );
      pvVar27 = local_d0.data;
      Mat::~Mat(&local_d0);
      Mat::channel(&local_d0,kernel,iVar29);
      pvVar28 = local_d0.data;
      Mat::~Mat(&local_d0);
      fVar42 = *(float *)*pauVar35;
      fVar45 = *(float *)(*pauVar35 + 4);
      fVar46 = *(float *)(*pauVar35 + 8);
      fVar47 = *(float *)(*pauVar35 + 0xc);
      lVar30 = 0;
      iVar31 = _h;
      while (bVar41 = iVar31 != 0, iVar31 = iVar31 + -1, bVar41) {
        fVar5 = *(float *)((undefined1 *)pvVar27 + lVar30);
        fVar8 = *(float *)((undefined1 *)pvVar27 + lVar30 + 4);
        fVar9 = *(float *)((undefined1 *)pvVar27 + lVar30 + 8);
        pfVar1 = (float *)((undefined1 *)pvVar28 + lVar30 * 4);
        fVar10 = *(float *)((undefined1 *)pvVar27 + lVar30 + 0xc);
        pfVar2 = (float *)((undefined1 *)pvVar28 + lVar30 * 4 + 0x10);
        pfVar3 = (float *)(*(undefined1 (*) [32])((long)pvVar28 + 0x20) + lVar30 * 4);
        pfVar4 = (float *)(*(undefined1 (*) [32])((long)pvVar28 + 0x20) + lVar30 * 4 + 0x10);
        fVar42 = fVar5 * *pfVar1 + fVar42 + fVar8 * *pfVar2 + fVar9 * *pfVar3 + fVar10 * *pfVar4;
        fVar45 = fVar5 * pfVar1[1] + fVar45 + fVar8 * pfVar2[1] + fVar9 * pfVar3[1] +
                 fVar10 * pfVar4[1];
        fVar46 = fVar5 * pfVar1[2] + fVar46 + fVar8 * pfVar2[2] + fVar9 * pfVar3[2] +
                 fVar10 * pfVar4[2];
        fVar47 = fVar5 * pfVar1[3] + fVar47 + fVar8 * pfVar2[3] + fVar9 * pfVar3[3] +
                 fVar10 * pfVar4[3];
        lVar30 = lVar30 + 0x10;
      }
      *(float *)*pauVar38 = fVar42;
      *(float *)(*pauVar38 + 4) = fVar45;
      *(float *)(*pauVar38 + 8) = fVar46;
      *(float *)(*pauVar38 + 0xc) = fVar47;
      pauVar38 = (undefined1 (*) [32])(*pauVar38 + 0x10);
      uVar34 = (ulong)(uVar36 + 1);
    }
  }
  Mat::~Mat(&tmp);
  return;
}

Assistant:

static void conv1x1s1_sgemm_pack4_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    int outch = top_blob.c;

    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int size = w * h;

    const float* bias = _bias;

    // interleave
    Mat tmp(4, inch, size / 4 + (size % 4) / 2 + size % 2, elemsize, elempack, opt.workspace_allocator);
    {
        int nn_size;
        int remain_size_start;

        remain_size_start = 0;
        nn_size = (size - remain_size_start) >> 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 4;

            const float* img0 = bottom_blob.channel(0);
            img0 += i * 4;

            float* tmpptr = tmp.channel(i / 4);

            for (int q = 0; q < inch; q++)
            {
                __m128 _r0 = _mm_loadu_ps(img0);
                __m128 _r1 = _mm_loadu_ps(img0 + 4);
                __m128 _r2 = _mm_loadu_ps(img0 + 8);
                __m128 _r3 = _mm_loadu_ps(img0 + 12);
                _mm_storeu_ps(tmpptr, _r0);
                _mm_storeu_ps(tmpptr + 4, _r1);
                _mm_storeu_ps(tmpptr + 8, _r2);
                _mm_storeu_ps(tmpptr + 12, _r3);

                tmpptr += 16;
                img0 += bottom_blob.cstep * 4;
            }
        }

        remain_size_start += nn_size << 2;
        nn_size = (size - remain_size_start) >> 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ii = 0; ii < nn_size; ii++)
        {
            int i = remain_size_start + ii * 2;

            const float* img0 = bottom_blob.channel(0);
            img0 += i * 4;

            float* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);

            for (int q = 0; q < inch; q++)
            {
                __m128 _r0 = _mm_loadu_ps(img0);
                __m128 _r1 = _mm_loadu_ps(img0 + 4);
                _mm_storeu_ps(tmpptr, _r0);
                _mm_storeu_ps(tmpptr + 4, _r1);

                tmpptr += 8;
                img0 += bottom_blob.cstep * 4;
            }
        }

        remain_size_start += nn_size << 1;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = remain_size_start; i < size; i++)
        {
            const float* img0 = bottom_blob.channel(0);
            img0 += i * 4;

            float* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);

            for (int q = 0; q < inch; q++)
            {
                __m128 _r0 = _mm_loadu_ps(img0);
                _mm_storeu_ps(tmpptr, _r0);

                tmpptr += 4;
                img0 += bottom_blob.cstep * 4;
            }
        }
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr0 = top_blob.channel(p);

        const float zeros[4] = {0.f, 0.f, 0.f, 0.f};
        const float* biasptr = bias ? bias + p * 4 : zeros;

        int i = 0;
        for (; i + 3 < size; i += 4)
        {
            float* tmpptr = tmp.channel(i / 4);
            const float* kptr0 = (const float*)kernel.channel(p);

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _mm_loadu_ps(biasptr);
            __m128 _sum2 = _mm_loadu_ps(biasptr);
            __m128 _sum3 = _mm_loadu_ps(biasptr);

            for (int q = 0; q < inch; q++)
            {
                __m128 _val00 = _mm_load1_ps(tmpptr);
                __m128 _val01 = _mm_load1_ps(tmpptr + 1);
                __m128 _val02 = _mm_load1_ps(tmpptr + 2);
                __m128 _val03 = _mm_load1_ps(tmpptr + 3);
                __m128 _val10 = _mm_load1_ps(tmpptr + 4);
                __m128 _val11 = _mm_load1_ps(tmpptr + 5);
                __m128 _val12 = _mm_load1_ps(tmpptr + 6);
                __m128 _val13 = _mm_load1_ps(tmpptr + 7);
                __m128 _val20 = _mm_load1_ps(tmpptr + 8);
                __m128 _val21 = _mm_load1_ps(tmpptr + 9);
                __m128 _val22 = _mm_load1_ps(tmpptr + 10);
                __m128 _val23 = _mm_load1_ps(tmpptr + 11);
                __m128 _val30 = _mm_load1_ps(tmpptr + 12);
                __m128 _val31 = _mm_load1_ps(tmpptr + 13);
                __m128 _val32 = _mm_load1_ps(tmpptr + 14);
                __m128 _val33 = _mm_load1_ps(tmpptr + 15);

                __m128 _w0 = _mm_load_ps(kptr0);
                __m128 _w1 = _mm_load_ps(kptr0 + 4);
                __m128 _w2 = _mm_load_ps(kptr0 + 8);
                __m128 _w3 = _mm_load_ps(kptr0 + 12);

                _sum0 = _mm_comp_fmadd_ps(_w0, _val00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_w1, _val01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_w2, _val02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_w3, _val03, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_w0, _val10, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_w1, _val11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_w2, _val12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_w3, _val13, _sum1);
                _sum2 = _mm_comp_fmadd_ps(_w0, _val20, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_w1, _val21, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_w2, _val22, _sum2);
                _sum2 = _mm_comp_fmadd_ps(_w3, _val23, _sum2);
                _sum3 = _mm_comp_fmadd_ps(_w0, _val30, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_w1, _val31, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_w2, _val32, _sum3);
                _sum3 = _mm_comp_fmadd_ps(_w3, _val33, _sum3);

                tmpptr += 16;
                kptr0 += 16;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            _mm_store_ps(outptr0 + 8, _sum2);
            _mm_store_ps(outptr0 + 12, _sum3);
            outptr0 += 16;
        }
        for (; i + 1 < size; i += 2)
        {
            float* tmpptr = tmp.channel(i / 4 + (i % 4) / 2);
            const float* kptr0 = (const float*)kernel.channel(p);

            __m128 _sum0 = _mm_loadu_ps(biasptr);
            __m128 _sum1 = _mm_loadu_ps(biasptr);

            for (int q = 0; q < inch; q++)
            {
                __m128 _val00 = _mm_load1_ps(tmpptr);
                __m128 _val01 = _mm_load1_ps(tmpptr + 1);
                __m128 _val02 = _mm_load1_ps(tmpptr + 2);
                __m128 _val03 = _mm_load1_ps(tmpptr + 3);
                __m128 _val10 = _mm_load1_ps(tmpptr + 4);
                __m128 _val11 = _mm_load1_ps(tmpptr + 5);
                __m128 _val12 = _mm_load1_ps(tmpptr + 6);
                __m128 _val13 = _mm_load1_ps(tmpptr + 7);

                __m128 _w0 = _mm_load_ps(kptr0);
                __m128 _w1 = _mm_load_ps(kptr0 + 4);
                __m128 _w2 = _mm_load_ps(kptr0 + 8);
                __m128 _w3 = _mm_load_ps(kptr0 + 12);

                _sum0 = _mm_comp_fmadd_ps(_w0, _val00, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_w1, _val01, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_w2, _val02, _sum0);
                _sum0 = _mm_comp_fmadd_ps(_w3, _val03, _sum0);
                _sum1 = _mm_comp_fmadd_ps(_w0, _val10, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_w1, _val11, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_w2, _val12, _sum1);
                _sum1 = _mm_comp_fmadd_ps(_w3, _val13, _sum1);

                tmpptr += 8;
                kptr0 += 16;
            }

            _mm_store_ps(outptr0, _sum0);
            _mm_store_ps(outptr0 + 4, _sum1);
            outptr0 += 8;
        }
        for (; i < size; i++)
        {
            float* tmpptr = tmp.channel(i / 4 + (i % 4) / 2 + i % 2);
            const float* kptr0 = (const float*)kernel.channel(p);

            __m128 _sum = _mm_loadu_ps(biasptr);

            for (int q = 0; q < inch; q++)
            {
                __m128 _val0 = _mm_load1_ps(tmpptr);
                __m128 _val1 = _mm_load1_ps(tmpptr + 1);
                __m128 _val2 = _mm_load1_ps(tmpptr + 2);
                __m128 _val3 = _mm_load1_ps(tmpptr + 3);

                __m128 _w0 = _mm_load_ps(kptr0);
                __m128 _w1 = _mm_load_ps(kptr0 + 4);
                __m128 _w2 = _mm_load_ps(kptr0 + 8);
                __m128 _w3 = _mm_load_ps(kptr0 + 12);

                _sum = _mm_comp_fmadd_ps(_w0, _val0, _sum);
                _sum = _mm_comp_fmadd_ps(_w1, _val1, _sum);
                _sum = _mm_comp_fmadd_ps(_w2, _val2, _sum);
                _sum = _mm_comp_fmadd_ps(_w3, _val3, _sum);

                tmpptr += 4;
                kptr0 += 16;
            }

            _mm_store_ps(outptr0, _sum);
            outptr0 += 4;
        }
    }

    //     // NOTE sgemm
    //     for (; p<outch; p++)
    //     {
    //         Mat out0 = top_blob.channel(p);
    //
    //         const float bias0 = bias ? bias[p] : 0.f;
    //
    //         float* outptr0 = out0;
    //
    //         for (int i=0; i<size; i++)
    //         {
    //             float sum = bias0;
    //
    //             const float* kptr = _kernel.channel(p);
    //
    //             for (int q=0; q<inch; q++)
    //             {
    //                 const float* img0 = bottom_blob.channel(q);
    //
    //                 sum += img0[i] * kptr[0];
    //                 kptr ++;
    //             }
    //
    //             outptr0[i] = sum;
    //         }
    //     }
}